

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

uint64_t uv__read_uint64(char *filename)

{
  int iVar1;
  uint64_t rc;
  char buf [32];
  
  rc = 0;
  iVar1 = uv__slurp(filename,buf,0x20);
  if (iVar1 == 0) {
    iVar1 = sscanf(buf,"%lu",&rc);
    if (iVar1 != 1) {
      iVar1 = bcmp(buf,"max\n",5);
      if (iVar1 == 0) {
        rc = 0xffffffffffffffff;
      }
    }
  }
  return rc;
}

Assistant:

static uint64_t uv__read_uint64(const char* filename) {
  char buf[32];  /* Large enough to hold an encoded uint64_t. */
  uint64_t rc;

  rc = 0;
  if (0 == uv__slurp(filename, buf, sizeof(buf)))
    if (1 != sscanf(buf, "%" PRIu64, &rc))
      if (0 == strcmp(buf, "max\n"))
        rc = UINT64_MAX;

  return rc;
}